

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O2

void __thiscall SQCompiler::Emit2ArgsOP(SQCompiler *this,SQOpcode op,SQInteger p3)

{
  SQFuncState *this_00;
  SQInteger arg2;
  SQInteger arg1;
  SQInteger arg0;
  
  arg2 = SQFuncState::PopTarget(this->_fs);
  arg1 = SQFuncState::PopTarget(this->_fs);
  this_00 = this->_fs;
  arg0 = SQFuncState::PushTarget(this_00,-1);
  SQFuncState::AddInstruction(this_00,op,arg0,arg1,arg2,p3);
  return;
}

Assistant:

void Emit2ArgsOP(SQOpcode op, SQInteger p3 = 0)
    {
        SQInteger p2 = _fs->PopTarget(); //src in OP_GET
        SQInteger p1 = _fs->PopTarget(); //key in OP_GET
        _fs->AddInstruction(op,_fs->PushTarget(), p1, p2, p3);
    }